

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction_by_rapt.cc
# Opt level: O2

bool __thiscall
sptk::PitchExtractionByRapt::Get
          (PitchExtractionByRapt *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<double,_std::allocator<double>_> *epochs,Polarity *polarity)

{
  int iVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  undefined1 auVar5 [16];
  int tmp_length;
  float *tmp_f0;
  int local_2c;
  float *local_28;
  
  if ((this->is_valid_ == true) &&
     ((waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    if (f0 == (vector<double,_std::allocator<double>_> *)0x0) {
      return true;
    }
    iVar1 = snack::cGet_f0(waveform,this->frame_shift_,this->sampling_rate_,this->lower_f0_,
                           this->upper_f0_,this->voicing_threshold_,&local_28,&local_2c);
    if (iVar1 == 0) {
      lVar2 = (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      lVar3 = lVar2 >> 3;
      auVar5._8_4_ = (int)(lVar2 >> 0x23);
      auVar5._0_8_ = lVar3;
      auVar5._12_4_ = 0x45300000;
      dVar4 = ceil(((auVar5._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
                   (double)this->frame_shift_);
      iVar1 = (int)dVar4;
      if (iVar1 < local_2c) {
        local_2c = iVar1;
      }
      std::vector<double,_std::allocator<double>_>::resize(f0,(long)iVar1);
      std::
      __copy_move_a<false,float*,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (local_28,local_28 + local_2c,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start);
      std::__fill_a1<double*,float>
                ((f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + local_2c,
                 (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish,local_28 + (long)local_2c + -1);
      snack::ckfree(local_28);
      return true;
    }
  }
  return false;
}

Assistant:

bool PitchExtractionByRapt::Get(
    const std::vector<double>& waveform, std::vector<double>* f0,
    std::vector<double>* epochs,
    PitchExtractionInterface::Polarity* polarity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty()) {
    return false;
  }

  if (NULL != f0) {
    float* tmp_f0;
    int tmp_length;
    if (0 != snack::cGet_f0(waveform, frame_shift_, sampling_rate_, lower_f0_,
                            upper_f0_, voicing_threshold_, &tmp_f0,
                            &tmp_length)) {
      return false;
    }
    const int target_length(static_cast<int>(
        std::ceil(static_cast<double>(waveform.size()) / frame_shift_)));
    if (target_length < tmp_length) {
      tmp_length = target_length;
    }
    f0->resize(target_length);
    std::copy(tmp_f0, tmp_f0 + tmp_length, f0->begin());
    std::fill(f0->begin() + tmp_length, f0->end(), tmp_f0[tmp_length - 1]);
    snack::ckfree(tmp_f0);
  }

  if (NULL != epochs) {
    // nothing to do
  }

  if (NULL != polarity) {
    // nothing to do
  }

  return true;
}